

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O1

void __thiscall FWeaponSlots::SendDifferences(FWeaponSlots *this,int playernum,FWeaponSlots *other)

{
  FWeaponSlot *pFVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  PClassWeapon *type;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  lVar13 = 0;
  do {
    uVar2 = other->Slots[lVar13].Weapons.Count;
    pFVar1 = this->Slots + lVar13;
    uVar3 = this->Slots[lVar13].Weapons.Count;
    lVar6 = (long)(int)uVar3;
    if (uVar2 == uVar3) {
      uVar8 = uVar3 + 1;
      lVar10 = lVar6 << 4;
      do {
        uVar9 = (int)uVar3 >> 0x1f & uVar3;
        if (lVar6 < 1) break;
        if (uVar8 - 2 < uVar2) {
          lVar11 = *(long *)((long)&other->Slots[lVar13].Weapons.Array[-1].Type + lVar10);
        }
        else {
          lVar11 = 0;
        }
        if (uVar8 - 2 < uVar3) {
          lVar12 = *(long *)((long)&(pFVar1->Weapons).Array[-1].Type + lVar10);
        }
        else {
          lVar12 = 0;
        }
        uVar8 = uVar8 - 1;
        lVar6 = lVar6 + -1;
        uVar9 = uVar8;
        lVar10 = lVar10 + -0x10;
      } while (lVar11 == lVar12);
      if (0 < (int)uVar9) goto LAB_004b0277;
    }
    else {
LAB_004b0277:
      iVar4 = 0x39;
      if (consoleplayer != playernum) {
        Net_WriteByte('C');
        iVar4 = playernum;
      }
      Net_WriteByte((BYTE)iVar4);
      Net_WriteByte((BYTE)lVar13);
      Net_WriteByte((BYTE)(pFVar1->Weapons).Count);
      uVar2 = (pFVar1->Weapons).Count;
      uVar5 = (ulong)uVar2;
      if (0 < (int)uVar2) {
        lVar6 = 0;
        uVar7 = 0;
        do {
          if (uVar7 < (uVar5 & 0xffffffff)) {
            type = *(PClassWeapon **)((long)&((pFVar1->Weapons).Array)->Type + lVar6);
          }
          else {
            type = (PClassWeapon *)0x0;
          }
          Net_WriteWeapon(type);
          uVar7 = uVar7 + 1;
          uVar5 = (ulong)(int)(pFVar1->Weapons).Count;
          lVar6 = lVar6 + 0x10;
        } while ((long)uVar7 < (long)uVar5);
      }
    }
    lVar13 = lVar13 + 1;
    if (lVar13 == 10) {
      return;
    }
  } while( true );
}

Assistant:

void FWeaponSlots::SendDifferences(int playernum, const FWeaponSlots &other)
{
	int i, j;

	for (i = 0; i < NUM_WEAPON_SLOTS; ++i)
	{
		if (other.Slots[i].Size() == Slots[i].Size())
		{
			for (j = (int)Slots[i].Size(); j-- > 0; )
			{
				if (other.Slots[i].GetWeapon(j) != Slots[i].GetWeapon(j))
				{
					break;
				}
			}
			if (j < 0)
			{ // The two slots are the same.
				continue;
			}
		}
		// The slots differ. Send mine.
		if (playernum == consoleplayer)
		{
			Net_WriteByte(DEM_SETSLOT);
		}
		else
		{
			Net_WriteByte(DEM_SETSLOTPNUM);
			Net_WriteByte(playernum);
		}
		Net_WriteByte(i);
		Net_WriteByte(Slots[i].Size());
		for (j = 0; j < Slots[i].Size(); ++j)
		{
			Net_WriteWeapon(Slots[i].GetWeapon(j));
		}
	}
}